

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<cm::optional<FilterOptions>_> * __thiscall
cmJSONHelperBuilder::
Optional<cmCMakePresetsGraph::TestPreset::FilterOptions,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::FilterOptions>>
          (cmJSONHelper<cm::optional<FilterOptions>_> *__return_storage_ptr__,
          cmJSONHelperBuilder *this,Object<cmCMakePresetsGraph::TestPreset::FilterOptions> *func)

{
  Object<cmCMakePresetsGraph::TestPreset::FilterOptions> local_60;
  cmJSONHelperBuilder *local_18;
  Object<cmCMakePresetsGraph::TestPreset::FilterOptions> *func_local;
  
  local_18 = this;
  func_local = (Object<cmCMakePresetsGraph::TestPreset::FilterOptions> *)__return_storage_ptr__;
  Object<cmCMakePresetsGraph::TestPreset::FilterOptions>::Object
            (&local_60,(Object<cmCMakePresetsGraph::TestPreset::FilterOptions> *)this);
  std::
  function<bool(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)>
  ::
  function<cmJSONHelperBuilder::Optional<cmCMakePresetsGraph::TestPreset::FilterOptions,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::FilterOptions>>(cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::FilterOptions>)::_lambda(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)>
              *)__return_storage_ptr__,(anon_class_72_1_898bcfc2 *)&local_60);
  Optional<cmCMakePresetsGraph::TestPreset::FilterOptions,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::FilterOptions>>(cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::FilterOptions>)
  ::
  {lambda(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)#1}
  ::~function((_lambda_std__optional<cmCMakePresetsGraph::TestPreset::FilterOptions>__Json__Value_const__cmJSONState___1_
               *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<cm::optional<T>> Optional(F func)
  {
    return [func](cm::optional<T>& out, const Json::Value* value,
                  cmJSONState* state) -> bool {
      if (!value) {
        out.reset();
        return true;
      }
      out.emplace();
      return func(*out, value, state);
    };
  }